

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
          (CodedInputStream *this,uint32 *value)

{
  bool bVar1;
  uint uVar2;
  uint32 *in_RSI;
  CodedInputStream *in_RDI;
  uint8 *ptr;
  uint8 bytes [4];
  int in_stack_ffffffffffffffcc;
  CodedInputStream *in_stack_ffffffffffffffd8;
  uint8 *buffer;
  uint8 local_1c [4];
  uint32 *local_18;
  
  local_18 = in_RSI;
  uVar2 = BufferSize(in_RDI);
  if (uVar2 < 4) {
    bVar1 = ReadRaw(in_stack_ffffffffffffffd8,in_RDI,in_stack_ffffffffffffffcc);
    if (!bVar1) {
      return false;
    }
    buffer = local_1c;
  }
  else {
    buffer = in_RDI->buffer_;
    Advance(in_RDI,4);
  }
  ReadLittleEndian32FromArray(buffer,local_18);
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian32Fallback(uint32* value) {
  uint8 bytes[sizeof(*value)];

  const uint8* ptr;
  if (BufferSize() >= sizeof(*value)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(sizeof(*value));
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, sizeof(*value))) return false;
    ptr = bytes;
  }
  ReadLittleEndian32FromArray(ptr, value);
  return true;
}